

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QDockWidget * __thiscall QMainWindowTabBar::dockAt(QMainWindowTabBar *this,int index)

{
  QLayoutItem *pQVar1;
  uint uVar2;
  int iVar3;
  QMainWindowLayout *this_00;
  QDockAreaLayoutInfo *this_01;
  undefined4 extraout_var;
  QDockWidget *pQVar4;
  
  this_00 = qt_mainwindow_layout(*(QMainWindow **)(this + 0x28));
  this_01 = QMainWindowLayout::dockInfo((QMainWindowLayout *)this_00,(QWidget *)this);
  if (this_01 != (QDockAreaLayoutInfo *)0x0) {
    uVar2 = QDockAreaLayoutInfo::tabIndexToListIndex(this_01,index);
    if (-1 < (int)uVar2) {
      pQVar1 = (this_01->item_list).d.ptr[uVar2].widgetItem;
      if (pQVar1 != (QLayoutItem *)0x0) {
        iVar3 = (*pQVar1->_vptr_QLayoutItem[0xd])();
        pQVar4 = QtPrivate::qobject_cast_helper<QDockWidget*,QObject>
                           ((QObject *)CONCAT44(extraout_var,iVar3));
        return pQVar4;
      }
    }
  }
  return (QDockWidget *)0x0;
}

Assistant:

QDockWidget *QMainWindowTabBar::dockAt(int index) const
{
    QMainWindowTabBar *that = const_cast<QMainWindowTabBar *>(this);
    QMainWindowLayout* mlayout = qt_mainwindow_layout(mainWindow);
    QDockAreaLayoutInfo *info = mlayout->dockInfo(that);
    if (!info)
        return nullptr;

    const int itemIndex = info->tabIndexToListIndex(index);
    if (itemIndex >= 0) {
        Q_ASSERT(itemIndex < info->item_list.count());
        const QDockAreaLayoutItem &item = info->item_list.at(itemIndex);
        return item.widgetItem ? qobject_cast<QDockWidget *>(item.widgetItem->widget()) : nullptr;
    }

    return nullptr;
}